

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
          (QMovableArrayOps<QCss::Selector> *this,qsizetype i,Selector *args)

{
  qsizetype *pqVar1;
  Selector **ppSVar2;
  Data *pDVar3;
  Selector *pSVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_68;
  QArrayDataPointer<QCss::BasicSelector> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.size
        == i) {
      qVar5 = QArrayDataPointer<QCss::Selector>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::Selector> *)this);
      if (qVar5 == 0) goto LAB_0054f8c3;
      QArrayDataPointer<QCss::BasicSelector>::QArrayDataPointer
                ((QArrayDataPointer<QCss::BasicSelector> *)
                 ((this->super_QGenericArrayOps<QCss::Selector>).
                  super_QArrayDataPointer<QCss::Selector>.ptr +
                 (this->super_QGenericArrayOps<QCss::Selector>).
                 super_QArrayDataPointer<QCss::Selector>.size),
                 (QArrayDataPointer<QCss::BasicSelector> *)args);
LAB_0054f9fa:
      pqVar1 = &(this->super_QGenericArrayOps<QCss::Selector>).
                super_QArrayDataPointer<QCss::Selector>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_0054f9b9;
    }
LAB_0054f8c3:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QCss::Selector>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::Selector> *)this);
      if (qVar5 != 0) {
        QArrayDataPointer<QCss::BasicSelector>::QArrayDataPointer
                  ((QArrayDataPointer<QCss::BasicSelector> *)
                   ((this->super_QGenericArrayOps<QCss::Selector>).
                    super_QArrayDataPointer<QCss::Selector>.ptr + -1),
                   (QArrayDataPointer<QCss::BasicSelector> *)args);
        ppSVar2 = &(this->super_QGenericArrayOps<QCss::Selector>).
                   super_QArrayDataPointer<QCss::Selector>.ptr;
        *ppSVar2 = *ppSVar2 + -1;
        goto LAB_0054f9fa;
      }
    }
  }
  local_40.d = (args->basicSelectors).d.d;
  local_40.ptr = (args->basicSelectors).d.ptr;
  local_40.size = (args->basicSelectors).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar6 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
          size != 0;
  QArrayDataPointer<QCss::Selector>::detachAndGrow
            ((QArrayDataPointer<QCss::Selector> *)this,(uint)(i == 0 && bVar6),1,(Selector **)0x0,
             (QArrayDataPointer<QCss::Selector> *)0x0);
  if (i == 0 && bVar6) {
    pSVar4 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
             ptr;
    pSVar4[-1].basicSelectors.d.d = local_40.d;
    pSVar4[-1].basicSelectors.d.ptr = local_40.ptr;
    pSVar4[-1].basicSelectors.d.size = local_40.size;
    (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.ptr =
         pSVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>
              .size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_68,(QArrayDataPointer<QCss::Selector> *)this,i,1);
    ((local_68.displaceFrom)->basicSelectors).d.d = local_40.d;
    ((local_68.displaceFrom)->basicSelectors).d.ptr = local_40.ptr;
    ((local_68.displaceFrom)->basicSelectors).d.size = local_40.size;
    local_68.displaceFrom = local_68.displaceFrom + 1;
    (local_68.data)->size = (local_68.data)->size + local_68.nInserts;
  }
  local_40.size = 0;
  local_40.ptr = (BasicSelector *)0x0;
  local_40.d = (Data *)0x0;
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_40);
LAB_0054f9b9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }